

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O2

char * __thiscall google::protobuf::FastInt64ToBufferLeft(protobuf *this,int64 i,char *buffer)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  char *pcVar3;
  uint uVar4;
  
  if ((long)this < 0) {
    *(undefined1 *)i = 0x2d;
    pcVar3 = FastUInt64ToBufferLeft((protobuf *)-(long)this,i + 1,buffer);
    return pcVar3;
  }
  if ((ulong)this >> 0x20 == 0) {
    pcVar3 = FastUInt32ToBufferLeft((protobuf *)((ulong)this & 0xffffffff),(uint32)i,buffer);
    return pcVar3;
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = this;
  pcVar3 = FastUInt64ToBufferLeft
                     (SUB168(auVar2 / ZEXT816(1000000000),0),i,(char *)((ulong)this % 1000000000));
  uVar4 = (int)this + SUB164(auVar2 / ZEXT816(1000000000),0) * -1000000000;
  uVar1 = (ulong)uVar4 / 10000000;
  *(undefined2 *)pcVar3 = *(undefined2 *)(two_ASCII_digits + uVar1 * 2);
  uVar4 = (int)uVar1 * -10000000 + uVar4;
  uVar1 = (ulong)uVar4 / 100000;
  *(undefined2 *)(pcVar3 + 2) = *(undefined2 *)(two_ASCII_digits + uVar1 * 2);
  uVar4 = (int)uVar1 * -100000 + uVar4;
  uVar1 = (ulong)uVar4 / 1000;
  *(undefined2 *)(pcVar3 + 4) = *(undefined2 *)(two_ASCII_digits + uVar1 * 2);
  uVar4 = (int)uVar1 * -1000 + uVar4;
  uVar1 = (ulong)uVar4 / 10;
  *(undefined2 *)(pcVar3 + 6) = *(undefined2 *)(two_ASCII_digits + uVar1 * 2);
  pcVar3[8] = (char)uVar1 * -10 + (char)uVar4 + '0';
  pcVar3[9] = '\0';
  return pcVar3 + 9;
}

Assistant:

char* FastInt64ToBufferLeft(int64 i, char* buffer) {
  uint64 u = 0;
  if (i < 0) {
    *buffer++ = '-';
    u -= i;
  } else {
    u = i;
  }
  return FastUInt64ToBufferLeft(u, buffer);
}